

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse2_128_8.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  longlong lVar5;
  longlong lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  longlong lVar11;
  longlong lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  char cVar29;
  char cVar30;
  byte bVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  __m128i *ptr;
  int8_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  uint uVar35;
  ulong extraout_RDX;
  ulong extraout_RDX_01;
  longlong lVar37;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  longlong extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  longlong extraout_XMM0_Qa_09;
  longlong extraout_XMM0_Qa_10;
  longlong extraout_XMM0_Qa_11;
  longlong extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  longlong extraout_XMM0_Qb_05;
  longlong extraout_XMM0_Qb_06;
  longlong extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  longlong extraout_XMM0_Qb_09;
  longlong extraout_XMM0_Qb_10;
  longlong extraout_XMM0_Qb_11;
  longlong extraout_XMM0_Qb_12;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i alVar38;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i alVar39;
  int32_t in_stack_fffffffffffff8c8;
  int local_71c;
  long local_718;
  long local_710;
  int local_708;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int8_t *t;
  __m128i vCompare;
  __m128i vFt;
  __m128i vW;
  __m128i *pvW;
  __m128i vHp;
  __m128i vH;
  __m128i vF;
  __m128i vHt;
  __m128i vE;
  __m128i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_8_t e;
  __m128i_8_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vPosMask;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  char local_569;
  int8_t score;
  __m128i vZero;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapper;
  __m128i *pvH;
  __m128i *pvHt;
  int8_t *boundary;
  __m128i *pvE;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  ulong uVar36;
  longlong extraout_RDX_00;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse2_128_8","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile8).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse2_128_8",
            "profile->profile8.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse2_128_8",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan_profile_sse2_128_8",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse2_128_8","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan_profile_sse2_128_8","s2Len"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan_profile_sse2_128_8","open"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan_profile_sse2_128_8","gap")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._4_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar32 = (iVar1 + 0xf) / 0x10;
    iVar33 = ~((iVar1 + -1) / iVar32) + 0x10;
    pvVar4 = (profile->profile8).score;
    s1_beg_local._0_1_ = (char)open;
    uVar7 = CONCAT17((char)s1_beg_local,
                     CONCAT16((char)s1_beg_local,
                              CONCAT15((char)s1_beg_local,
                                       CONCAT14((char)s1_beg_local,
                                                CONCAT13((char)s1_beg_local,
                                                         CONCAT12((char)s1_beg_local,
                                                                  CONCAT11((char)s1_beg_local,
                                                                           (char)s1_beg_local)))))))
    ;
    uVar8 = CONCAT17((char)s1_beg_local,
                     CONCAT16((char)s1_beg_local,
                              CONCAT15((char)s1_beg_local,
                                       CONCAT14((char)s1_beg_local,
                                                CONCAT13((char)s1_beg_local,
                                                         CONCAT12((char)s1_beg_local,
                                                                  CONCAT11((char)s1_beg_local,
                                                                           (char)s1_beg_local)))))))
    ;
    i._0_1_ = (char)gap;
    uVar9 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  CONCAT12((char)i,CONCAT11((char)i,(char)i)))))));
    uVar10 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  CONCAT12((char)i,CONCAT11((char)i,(char)i)))))));
    if (ppVar3->min <= -open) {
      s1_beg_local._0_1_ = -(char)ppVar3->min;
    }
    cVar29 = (char)s1_beg_local + -0x7f;
    cVar30 = ((byte)ppVar3->max ^ 0x7f) - 1;
    lVar11 = CONCAT17(cVar29,CONCAT16(cVar29,CONCAT15(cVar29,CONCAT14(cVar29,CONCAT13(cVar29,
                                                  CONCAT12(cVar29,CONCAT11(cVar29,cVar29)))))));
    lVar12 = CONCAT17(cVar29,CONCAT16(cVar29,CONCAT15(cVar29,CONCAT14(cVar29,CONCAT13(cVar29,
                                                  CONCAT12(cVar29,CONCAT11(cVar29,cVar29)))))));
    vSaturationCheckMax[1] =
         CONCAT17(cVar30,CONCAT16(cVar30,CONCAT15(cVar30,CONCAT14(cVar30,CONCAT13(cVar30,CONCAT12(
                                                  cVar30,CONCAT11(cVar30,cVar30)))))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar30,CONCAT16(cVar30,CONCAT15(cVar30,CONCAT14(cVar30,CONCAT13(cVar30,CONCAT12(
                                                  cVar30,CONCAT11(cVar30,cVar30)))))));
    pvP._0_1_ = (char)iVar33;
    vSegLenXgap[1] = 0;
    iVar34 = s1_beg;
    _mm_insert_epi8_rpl((__m128i)ZEXT416((uint)(int)cVar29),(int8_t)((iVar1 + -1) % iVar32),
                        (int)ppVar3);
    bVar31 = -(char)iVar32 * (char)i;
    auVar18._8_8_ = extraout_XMM0_Qb;
    auVar18._0_8_ = extraout_XMM0_Qa;
    auVar17._8_8_ =
         CONCAT17(bVar31,CONCAT16(bVar31,CONCAT15(bVar31,CONCAT14(bVar31,CONCAT13(bVar31,CONCAT12(
                                                  bVar31,CONCAT11(bVar31,bVar31))))))) << 8 |
         (ulong)bVar31;
    auVar17._0_8_ =
         CONCAT17(bVar31,CONCAT16(bVar31,CONCAT15(bVar31,CONCAT14(bVar31,CONCAT13(bVar31,CONCAT12(
                                                  bVar31,CONCAT11(bVar31,bVar31))))))) << 8;
    _result = paddsb(auVar18,auVar17);
    vSegLenXgap[1] = extraout_XMM0_Qa;
    _segNum = (parasail_profile_t *)parasail_result_new_table1(iVar32 * 0x10,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x10100402;
      uVar35 = 0;
      if (s1_beg != 0) {
        uVar35 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar35 | *(uint *)&_segNum->field_0xc;
      uVar35 = 0;
      if (s1_end != 0) {
        uVar35 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar35 | *(uint *)&_segNum->field_0xc;
      uVar35 = 0;
      if (s2_beg != 0) {
        uVar35 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar35 | *(uint *)&_segNum->field_0xc;
      uVar35 = 0;
      if (s2_end != 0) {
        uVar35 = 0x8000;
      }
      *(uint *)&_segNum->field_0xc = uVar35 | *(uint *)&_segNum->field_0xc;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      ptr = parasail_memalign___m128i(0x10,(long)iVar32);
      ptr_00 = parasail_memalign_int8_t(0x10,(long)(s2Len + 1));
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar32);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar32);
      alVar39[0] = (size_t)iVar32;
      lVar37 = 0x10;
      ptr_03 = parasail_memalign___m128i(0x10,alVar39[0]);
      if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        uVar36 = extraout_RDX;
        for (k = 0; k < iVar32; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 0x10; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            if (s1_beg == 0) {
              uVar35 = h.m[1]._0_4_ * iVar32 + k;
              uVar36 = (ulong)uVar35;
              local_708 = -(gap * uVar35) - open;
            }
            else {
              local_708 = 0;
            }
            local_718 = (long)local_708;
            local_710 = local_718;
            if (local_718 < -0x80) {
              local_710 = -0x80;
            }
            e.v[(long)(int)h.m[1]._0_4_ + 8] = (int8_t)local_710;
            local_718 = local_718 - open;
            if (local_718 < -0x80) {
              local_718 = -0x80;
            }
            *(char *)((long)&tmp + (long)(int)h.m[1]._0_4_) = (char)local_718;
          }
          ptr_02[(int)h.m[1]._4_4_][0] = e.m[1];
          ptr_02[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = '\0';
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            uVar36 = (ulong)(k - 1U);
            local_71c = -(gap * (k - 1U)) - open;
          }
          else {
            local_71c = 0;
          }
          if (local_71c < -0x80) {
            local_71c = -0x80;
          }
          uVar36 = CONCAT71((int7)(uVar36 >> 8),(int8_t)local_71c);
          ptr_00[k] = (int8_t)local_71c;
        }
        auVar26._8_8_ = uVar8;
        auVar26._0_8_ = uVar7;
        register0x00001200 = psubsb(ZEXT816(0),auVar26);
        k = iVar32;
        while (k = k + -1, -1 < k) {
          b[1] = (long)k * 0x10;
          ptr_03[k][0] = vE[1];
          ptr_03[k][1] = vGapper[0];
          auVar25._8_8_ = uVar10;
          auVar25._0_8_ = uVar9;
          register0x00001200 = psubsb(stack0xfffffffffffff9b8,auVar25);
          alVar38[1] = alVar39[0];
          alVar38[0] = lVar37;
          b[0] = uVar36;
          alVar38 = _mm_min_epi8_rpl(alVar38,b);
          uVar36 = alVar38[1];
          vSaturationCheckMax[1] = extraout_XMM0_Qa_00;
          vSaturationCheckMin[0] = extraout_XMM0_Qb_00;
        }
        vPosMask[1] = lVar11;
        vMaxH[0] = lVar12;
        vMaxH[1] = lVar11;
        vSaturationCheckMax[0] = lVar12;
        for (end_query = 0; end_query < s2Len; end_query = end_query + 1) {
          a[0] = (ulong)(uint)(int)ptr_00[end_query];
          a[1] = 0;
          _mm_insert_epi8_rpl(a,(int8_t)uVar36,end_query);
          vHp[0] = extraout_XMM0_Qb_01;
          pvW = (__m128i *)extraout_XMM0_Qa_01;
          b_06[1] = (long)end_query;
          uVar36 = (ulong)(byte)s2[b_06[1]];
          iVar2 = ppVar3->mapper[uVar36];
          auVar24._8_8_ = lVar12;
          auVar24._0_8_ = lVar11;
          register0x00001200 = psubsb(auVar24,(undefined1  [16])*ptr_03);
          for (k = 0; k < iVar32; k = k + 1) {
            alVar39 = ptr_02[k];
            b_00[1] = (long)k * 0x10;
            auVar17 = *(undefined1 (*) [16])((long)pvVar4 + b_00[1] + (long)(iVar2 * iVar32) * 0x10)
            ;
            auVar23._8_8_ = uVar10;
            auVar23._0_8_ = uVar9;
            psubsb((undefined1  [16])ptr[k],auVar23);
            auVar22._8_8_ = uVar8;
            auVar22._0_8_ = uVar7;
            psubsb((undefined1  [16])ptr_02[k],auVar22);
            a_00[1] = b_06[1];
            a_00[0] = a[0];
            b_00[0] = uVar36;
            alVar38 = _mm_max_epi8_rpl(a_00,b_00);
            b_01[0] = alVar38[1];
            paddsb((undefined1  [16])_pvW,auVar17);
            b_01[1] = (long)k * 0x10;
            paddsb(stack0xfffffffffffff998,(undefined1  [16])ptr_03[k]);
            a_01[1] = b_06[1];
            a_01[0] = a[0];
            alVar38 = _mm_max_epi8_rpl(a_01,b_01);
            b_02[0] = alVar38[1];
            a_02[1] = b_06[1];
            a_02[0] = a[0];
            b_02[1] = b_01[1];
            alVar38 = _mm_max_epi8_rpl(a_02,b_02);
            uVar36 = alVar38[1];
            vHt[0] = extraout_XMM0_Qb_03;
            vF[1] = extraout_XMM0_Qa_03;
            ptr[k][0] = extraout_XMM0_Qa_02;
            ptr[k][1] = extraout_XMM0_Qb_02;
            ptr_01[k][0] = extraout_XMM0_Qa_03;
            ptr_01[k][1] = extraout_XMM0_Qb_03;
            _pvW = alVar39;
          }
          b_06[1] = (long)(end_query + 1);
          alVar39[0] = 0;
          a_03[0] = (int *)(ulong)(uint)(int)ptr_00[b_06[1]];
          a_03[1] = 0;
          alVar38 = _mm_insert_epi8_rpl(a_03,(int8_t)uVar36,end_query + 1);
          b_03[0] = alVar38[1];
          auVar16._8_8_ = extraout_XMM0_Qb_04;
          auVar16._0_8_ = extraout_XMM0_Qa_04;
          paddsb(auVar16,(undefined1  [16])*ptr_03);
          a_04[1] = alVar39[0];
          a_04[0] = (longlong)a_03[0];
          b_03[1] = b_06[1];
          alVar38 = _mm_max_epi8_rpl(a_04,b_03);
          lVar37 = alVar38[1];
          vH[1] = extraout_XMM0_Qa_05;
          vF[0] = extraout_XMM0_Qb_05;
          for (k = 0; k < 0xe; k = k + 1) {
            auVar15._8_8_ = vF[0] << 8 | (ulong)vH[1] >> 0x38;
            auVar15._0_8_ = vH[1] << 8;
            paddsb(auVar15,_result);
            a_05[1] = alVar39[0];
            a_05[0] = (longlong)a_03[0];
            b_04[1]._0_4_ = 0xe;
            b_04[0] = lVar37;
            b_04[1]._4_4_ = 0;
            alVar38 = _mm_max_epi8_rpl(a_05,b_04);
            lVar37 = alVar38[1];
            vH[1] = extraout_XMM0_Qa_06;
            vF[0] = extraout_XMM0_Qb_06;
          }
          auVar14._8_8_ = vF[0] << 8 | (ulong)vH[1] >> 0x38;
          auVar14._0_8_ = vH[1] << 8;
          auVar13._8_8_ = extraout_XMM0_Qb;
          auVar13._0_8_ = vSegLenXgap[1];
          register0x00001200 = paddsb(auVar14,auVar13);
          a_06[1] = alVar39[0];
          a_06[0] = (longlong)a_03[0];
          b_05[1]._0_4_ = 0xe;
          b_05[0] = lVar37;
          b_05[1]._4_4_ = 0;
          alVar38 = _mm_max_epi8_rpl(a_06,b_05);
          lVar37 = alVar38[1];
          vHp[1] = extraout_XMM0_Qa_07;
          vH[0] = extraout_XMM0_Qb_07;
          for (k = 0; k < iVar32; k = k + 1) {
            b_06[1] = (long)k * 0x10;
            auVar21._8_8_ = uVar10;
            auVar21._0_8_ = uVar9;
            psubsb(stack0xfffffffffffff988,auVar21);
            auVar20._8_8_ = vH[0];
            auVar20._0_8_ = vHp[1];
            auVar19._8_8_ = uVar8;
            auVar19._0_8_ = uVar7;
            psubsb(auVar20,auVar19);
            a_07[1] = alVar39[0];
            a_07[0] = (longlong)a_03[0];
            b_06[0] = lVar37;
            alVar38 = _mm_max_epi8_rpl(a_07,b_06);
            b_07[0] = alVar38[1];
            vF[0] = extraout_XMM0_Qb_08;
            vH[1] = extraout_XMM0_Qa_08;
            a_08[1] = alVar39[0];
            a_08[0] = (longlong)a_03[0];
            b_07[1] = b_06[1];
            alVar38 = _mm_max_epi8_rpl(a_08,b_07);
            b_08[0] = alVar38[1];
            b_08[1] = (long)k * 0x10;
            ptr_02[k][0] = extraout_XMM0_Qa_09;
            ptr_02[k][1] = extraout_XMM0_Qb_09;
            a_09[1] = alVar39[0];
            a_09[0] = (longlong)a_03[0];
            alVar38 = _mm_min_epi8_rpl(a_09,b_08);
            b_09[0] = alVar38[1];
            a_10[1] = alVar39[0];
            a_10[0] = (longlong)a_03[0];
            b_09[1] = b_08[1];
            alVar38 = _mm_min_epi8_rpl(a_10,b_09);
            b_10[0] = alVar38[1];
            a_11[1] = alVar39[0];
            a_11[0] = (longlong)a_03[0];
            b_10[1] = b_08[1];
            _mm_max_epi8_rpl(a_11,b_10);
            a_03[0] = ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->rowcols->
                      score_row;
            alVar39[0] = (size_t)(uint)k;
            alVar39[1]._0_4_ = iVar32;
            alVar39[1]._4_4_ = 0;
            arr_store_si128(a_03[0],alVar39,end_query,s2Len,iVar34,in_stack_fffffffffffff8c8);
            lVar37 = extraout_RDX_00;
            vHp[1] = extraout_XMM0_Qa_09;
            vH[0] = extraout_XMM0_Qb_09;
            vMaxH[1] = extraout_XMM0_Qa_11;
            vSaturationCheckMax[0] = extraout_XMM0_Qb_11;
            vSaturationCheckMax[1] = extraout_XMM0_Qa_10;
            vSaturationCheckMin[0] = extraout_XMM0_Qb_10;
          }
          b_06[1] = (long)((iVar1 + -1) % iVar32);
          b_11[1] = b_06[1] * 0x10;
          lVar5 = ptr_02[b_06[1]][0];
          lVar6 = ptr_02[b_06[1]][1];
          local_98 = (char)lVar5;
          cStack_97 = (char)((ulong)lVar5 >> 8);
          cStack_96 = (char)((ulong)lVar5 >> 0x10);
          cStack_95 = (char)((ulong)lVar5 >> 0x18);
          cStack_94 = (char)((ulong)lVar5 >> 0x20);
          cStack_93 = (char)((ulong)lVar5 >> 0x28);
          cStack_92 = (char)((ulong)lVar5 >> 0x30);
          cStack_91 = (char)((ulong)lVar5 >> 0x38);
          cStack_90 = (char)lVar6;
          cStack_8f = (char)((ulong)lVar6 >> 8);
          cStack_8e = (char)((ulong)lVar6 >> 0x10);
          cStack_8d = (char)((ulong)lVar6 >> 0x18);
          cStack_8c = (char)((ulong)lVar6 >> 0x20);
          cStack_8b = (char)((ulong)lVar6 >> 0x28);
          cStack_8a = (char)((ulong)lVar6 >> 0x30);
          cStack_89 = (char)((ulong)lVar6 >> 0x38);
          local_a8 = (char)vPosMask[1];
          cStack_a7 = (char)((ulong)vPosMask[1] >> 8);
          cStack_a6 = (char)((ulong)vPosMask[1] >> 0x10);
          cStack_a5 = (char)((ulong)vPosMask[1] >> 0x18);
          cStack_a4 = (char)((ulong)vPosMask[1] >> 0x20);
          cStack_a3 = (char)((ulong)vPosMask[1] >> 0x28);
          cStack_a2 = (char)((ulong)vPosMask[1] >> 0x30);
          cStack_a1 = (char)((ulong)vPosMask[1] >> 0x38);
          cStack_a0 = (char)vMaxH[0];
          cStack_9f = (char)((ulong)vMaxH[0] >> 8);
          cStack_9e = (char)((ulong)vMaxH[0] >> 0x10);
          cStack_9d = (char)((ulong)vMaxH[0] >> 0x18);
          cStack_9c = (char)((ulong)vMaxH[0] >> 0x20);
          cStack_9b = (char)((ulong)vMaxH[0] >> 0x28);
          cStack_9a = (char)((ulong)vMaxH[0] >> 0x30);
          cStack_99 = (char)((ulong)vMaxH[0] >> 0x38);
          a[0] = CONCAT17(-((char)pvP == '\0'),
                          CONCAT16(-((char)pvP == '\x01'),
                                   CONCAT15(-((char)pvP == '\x02'),
                                            CONCAT14(-((char)pvP == '\x03'),
                                                     CONCAT13(-((char)pvP == '\x04'),
                                                              CONCAT12(-((char)pvP == '\x05'),
                                                                       CONCAT11(-((char)pvP ==
                                                                                 '\x06'),-((char)pvP
                                                                                          == '\a')))
                                                             ))))) &
                 CONCAT17(-(cStack_99 < cStack_89),
                          CONCAT16(-(cStack_9a < cStack_8a),
                                   CONCAT15(-(cStack_9b < cStack_8b),
                                            CONCAT14(-(cStack_9c < cStack_8c),
                                                     CONCAT13(-(cStack_9d < cStack_8d),
                                                              CONCAT12(-(cStack_9e < cStack_8e),
                                                                       CONCAT11(-(cStack_9f <
                                                                                 cStack_8f),
                                                                                -(cStack_a0 <
                                                                                 cStack_90))))))));
          a_12[1] = alVar39[0];
          a_12[0] = (longlong)a_03[0];
          b_11[0] = lVar37;
          alVar38 = _mm_max_epi8_rpl(a_12,b_11);
          uVar36 = alVar38[1];
          auVar28._8_8_ = a[0];
          auVar28._0_8_ =
               CONCAT17(-((char)pvP == '\b'),
                        CONCAT16(-((char)pvP == '\t'),
                                 CONCAT15(-((char)pvP == '\n'),
                                          CONCAT14(-((char)pvP == '\v'),
                                                   CONCAT13(-((char)pvP == '\f'),
                                                            CONCAT12(-((char)pvP == '\r'),
                                                                     CONCAT11(-((char)pvP == '\x0e')
                                                                              ,-((char)pvP == '\x0f'
                                                                                )))))))) &
               CONCAT17(-(cStack_a1 < cStack_91),
                        CONCAT16(-(cStack_a2 < cStack_92),
                                 CONCAT15(-(cStack_a3 < cStack_93),
                                          CONCAT14(-(cStack_a4 < cStack_94),
                                                   CONCAT13(-(cStack_a5 < cStack_95),
                                                            CONCAT12(-(cStack_a6 < cStack_96),
                                                                     CONCAT11(-(cStack_a7 <
                                                                               cStack_97),
                                                                              -(local_a8 < local_98)
                                                                             )))))));
          if ((((((((((((((((auVar28 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar28 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar28 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar28 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar28 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar28 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (a[0] >> 7 & 1) != 0) || (a[0] >> 0xf & 1) != 0) || (a[0] >> 0x17 & 1) != 0) ||
                 (a[0] >> 0x1f & 1) != 0) || (a[0] >> 0x27 & 1) != 0) || (a[0] >> 0x2f & 1) != 0) ||
              (a[0] >> 0x37 & 1) != 0) || (long)a[0] < 0) {
            matrix._4_4_ = end_query;
          }
          vPosMask[1] = extraout_XMM0_Qa_12;
          vMaxH[0] = extraout_XMM0_Qb_12;
        }
        local_569 = cVar29;
        if (s2_end != 0) {
          for (end_ref = 0; end_ref < iVar33; end_ref = end_ref + 1) {
          }
          a_13[1] = alVar39[0];
          a_13[0] = 0xf;
          local_569 = _mm_extract_epi8_rpl(a_13,(int)uVar36);
          uVar36 = extraout_RDX_01;
        }
        s1Len = iVar1 + -1;
        iVar34 = (int)uVar36;
        if (s1_end != 0) {
          _temp = ptr_02;
          for (k = 0; iVar34 = (int)uVar36, k < iVar32 * 0x10; k = k + 1) {
            uVar35 = (k % 0x10) * iVar32;
            uVar36 = (ulong)uVar35;
            iVar34 = k / 0x10 + uVar35;
            if (iVar34 < iVar1) {
              if (local_569 < (char)(*_temp)[0]) {
                local_569 = (char)(*_temp)[0];
                matrix._4_4_ = s2Len + -1;
                s1Len = iVar34;
              }
              else if ((((char)(*_temp)[0] == local_569) && (matrix._4_4_ == s2Len + -1)) &&
                      (iVar34 < s1Len)) {
                s1Len = iVar34;
              }
            }
            _temp = (__m128i *)((long)*_temp + 1);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          for (end_ref = 0; end_ref < iVar33; end_ref = end_ref + 1) {
          }
          a_14[1] = alVar39[0];
          a_14[0] = 0xf;
          local_569 = _mm_extract_epi8_rpl(a_14,iVar34);
          matrix._4_4_ = s2Len + -1;
          s1Len = iVar1 + -1;
        }
        local_28 = (char)vSaturationCheckMax[1];
        cStack_27 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_26 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_25 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_24 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_23 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_22 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_21 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_20 = (char)vSaturationCheckMin[0];
        cStack_1f = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_1e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_1d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_1c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_1b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_1a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_19 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_b8 = (char)vMaxH[1];
        cStack_b7 = (char)((ulong)vMaxH[1] >> 8);
        cStack_b6 = (char)((ulong)vMaxH[1] >> 0x10);
        cStack_b5 = (char)((ulong)vMaxH[1] >> 0x18);
        cStack_b4 = (char)((ulong)vMaxH[1] >> 0x20);
        cStack_b3 = (char)((ulong)vMaxH[1] >> 0x28);
        cStack_b2 = (char)((ulong)vMaxH[1] >> 0x30);
        cStack_b1 = (char)((ulong)vMaxH[1] >> 0x38);
        cStack_b0 = (char)vSaturationCheckMax[0];
        cStack_af = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_ae = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_ad = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_ac = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_ab = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_aa = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_a9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar36 = CONCAT17(-(cStack_19 < cVar29),
                          CONCAT16(-(cStack_1a < cVar29),
                                   CONCAT15(-(cStack_1b < cVar29),
                                            CONCAT14(-(cStack_1c < cVar29),
                                                     CONCAT13(-(cStack_1d < cVar29),
                                                              CONCAT12(-(cStack_1e < cVar29),
                                                                       CONCAT11(-(cStack_1f < cVar29
                                                                                 ),-(cStack_20 <
                                                                                    cVar29)))))))) |
                 CONCAT17(-(cVar30 < cStack_a9),
                          CONCAT16(-(cVar30 < cStack_aa),
                                   CONCAT15(-(cVar30 < cStack_ab),
                                            CONCAT14(-(cVar30 < cStack_ac),
                                                     CONCAT13(-(cVar30 < cStack_ad),
                                                              CONCAT12(-(cVar30 < cStack_ae),
                                                                       CONCAT11(-(cVar30 < cStack_af
                                                                                 ),-(cVar30 < 
                                                  cStack_b0))))))));
        auVar27._8_8_ = uVar36;
        auVar27._0_8_ =
             CONCAT17(-(cStack_21 < cVar29),
                      CONCAT16(-(cStack_22 < cVar29),
                               CONCAT15(-(cStack_23 < cVar29),
                                        CONCAT14(-(cStack_24 < cVar29),
                                                 CONCAT13(-(cStack_25 < cVar29),
                                                          CONCAT12(-(cStack_26 < cVar29),
                                                                   CONCAT11(-(cStack_27 < cVar29),
                                                                            -(local_28 < cVar29)))))
                                       ))) |
             CONCAT17(-(cVar30 < cStack_b1),
                      CONCAT16(-(cVar30 < cStack_b2),
                               CONCAT15(-(cVar30 < cStack_b3),
                                        CONCAT14(-(cVar30 < cStack_b4),
                                                 CONCAT13(-(cVar30 < cStack_b5),
                                                          CONCAT12(-(cVar30 < cStack_b6),
                                                                   CONCAT11(-(cVar30 < cStack_b7),
                                                                            -(cVar30 < local_b8)))))
                                       )));
        if ((((((((((((((((auVar27 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar27 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar27 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar27 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar27 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar36 >> 7 & 1) != 0) || (uVar36 >> 0xf & 1) != 0) || (uVar36 >> 0x17 & 1) != 0)
               || (uVar36 >> 0x1f & 1) != 0) || (uVar36 >> 0x27 & 1) != 0) ||
             (uVar36 >> 0x2f & 1) != 0) || (uVar36 >> 0x37 & 1) != 0) || (long)uVar36 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_569 = '\0';
          s1Len = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_569;
        *(int32_t *)((long)&_segNum->s1 + 4) = s1Len;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m128i vZero;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi8(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi8(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi8(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 1);
        vHp = _mm_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vE, vGapE),
                    _mm_subs_epi8(vH, vGapO));
            vHp = _mm_adds_epi8(vHp, vW);
            vF = _mm_max_epi8_rpl(vF, _mm_adds_epi8(vHt, pvGapper[i]));
            vHt = _mm_max_epi8_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 1);
        vHt = _mm_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi8_rpl(vF, _mm_adds_epi8(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 1);
            vFt = _mm_adds_epi8(vFt, vSegLenXgap);
            vF = _mm_max_epi8_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 1);
        vF = _mm_adds_epi8(vF, vNegInfFront);
        vH = _mm_max_epi8_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vF, vGapE),
                    _mm_subs_epi8(vH, vGapO));
            vH = _mm_max_epi8_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm_max_epi8_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}